

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O0

void png_read_filter_row_avg4_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  char cVar1;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  ulong extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  char cVar9;
  ulong uVar2;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  ulong extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  char cVar18;
  ulong uVar11;
  __m128i alVar19;
  __m128i avg;
  __m128i d;
  __m128i a;
  __m128i b;
  __m128i zero;
  size_t rb;
  png_const_bytep prev_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  
  avg[1] = 0;
  d[0] = 0;
  rb = (size_t)prev;
  prev_local = row;
  for (zero[1] = row_info->rowbytes + 4; 4 < (ulong)zero[1]; zero[1] = zero[1] + -4) {
    load4((void *)rb);
    alVar19 = load4(prev_local);
    local_a8 = (undefined1)avg[1];
    uStack_a7 = (undefined1)((ulong)avg[1] >> 8);
    uStack_a6 = (undefined1)((ulong)avg[1] >> 0x10);
    uStack_a5 = (undefined1)((ulong)avg[1] >> 0x18);
    uStack_a4 = (undefined1)((ulong)avg[1] >> 0x20);
    uStack_a3 = (undefined1)((ulong)avg[1] >> 0x28);
    uStack_a2 = (undefined1)((ulong)avg[1] >> 0x30);
    uStack_a1 = (undefined1)((ulong)avg[1] >> 0x38);
    uStack_a0 = (undefined1)d[0];
    uStack_9f = (undefined1)((ulong)d[0] >> 8);
    uStack_9e = (undefined1)((ulong)d[0] >> 0x10);
    uStack_9d = (undefined1)((ulong)d[0] >> 0x18);
    uStack_9c = (undefined1)((ulong)d[0] >> 0x20);
    uStack_9b = (undefined1)((ulong)d[0] >> 0x28);
    uStack_9a = (undefined1)((ulong)d[0] >> 0x30);
    uStack_99 = (undefined1)((ulong)d[0] >> 0x38);
    local_b8 = (undefined1)extraout_XMM0_Qa;
    uStack_b7 = (undefined1)(extraout_XMM0_Qa >> 8);
    uStack_b6 = (undefined1)(extraout_XMM0_Qa >> 0x10);
    uStack_b5 = (undefined1)(extraout_XMM0_Qa >> 0x18);
    uStack_b4 = (undefined1)(extraout_XMM0_Qa >> 0x20);
    uStack_b3 = (undefined1)(extraout_XMM0_Qa >> 0x28);
    uStack_b2 = (undefined1)(extraout_XMM0_Qa >> 0x30);
    uStack_b1 = (undefined1)(extraout_XMM0_Qa >> 0x38);
    uStack_b0 = (undefined1)extraout_XMM0_Qb;
    uStack_af = (undefined1)(extraout_XMM0_Qb >> 8);
    uStack_ae = (undefined1)(extraout_XMM0_Qb >> 0x10);
    uStack_ad = (undefined1)(extraout_XMM0_Qb >> 0x18);
    uStack_ac = (undefined1)(extraout_XMM0_Qb >> 0x20);
    uStack_ab = (undefined1)(extraout_XMM0_Qb >> 0x28);
    uStack_aa = (undefined1)(extraout_XMM0_Qb >> 0x30);
    uStack_a9 = (undefined1)(extraout_XMM0_Qb >> 0x38);
    cVar1 = pavgb(local_a8,local_b8);
    cVar3 = pavgb(uStack_a7,uStack_b7);
    cVar4 = pavgb(uStack_a6,uStack_b6);
    cVar5 = pavgb(uStack_a5,uStack_b5);
    cVar6 = pavgb(uStack_a4,uStack_b4);
    cVar7 = pavgb(uStack_a3,uStack_b3);
    cVar8 = pavgb(uStack_a2,uStack_b2);
    cVar9 = pavgb(uStack_a1,uStack_b1);
    cVar10 = pavgb(uStack_a0,uStack_b0);
    cVar12 = pavgb(uStack_9f,uStack_af);
    cVar13 = pavgb(uStack_9e,uStack_ae);
    cVar14 = pavgb(uStack_9d,uStack_ad);
    cVar15 = pavgb(uStack_9c,uStack_ac);
    cVar16 = pavgb(uStack_9b,uStack_ab);
    cVar17 = pavgb(uStack_9a,uStack_aa);
    cVar18 = pavgb(uStack_99,uStack_a9);
    uVar2 = (avg[1] ^ extraout_XMM0_Qa) & 0x101010101010101;
    uVar11 = (d[0] ^ extraout_XMM0_Qb) & 0x101010101010101;
    local_98 = (char)uVar2;
    cStack_97 = (char)(uVar2 >> 8);
    cStack_96 = (char)(uVar2 >> 0x10);
    cStack_95 = (char)(uVar2 >> 0x18);
    cStack_94 = (char)(uVar2 >> 0x20);
    cStack_93 = (char)(uVar2 >> 0x28);
    cStack_92 = (char)(uVar2 >> 0x30);
    cStack_91 = (char)(uVar2 >> 0x38);
    cStack_90 = (char)uVar11;
    cStack_8f = (char)(uVar11 >> 8);
    cStack_8e = (char)(uVar11 >> 0x10);
    cStack_8d = (char)(uVar11 >> 0x18);
    cStack_8c = (char)(uVar11 >> 0x20);
    cStack_8b = (char)(uVar11 >> 0x28);
    cStack_8a = (char)(uVar11 >> 0x30);
    cStack_89 = (char)(uVar11 >> 0x38);
    local_c8 = (char)extraout_XMM0_Qa_00;
    cStack_c7 = (char)((ulong)extraout_XMM0_Qa_00 >> 8);
    cStack_c6 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    cStack_c5 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    cStack_c4 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    cStack_c3 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    cStack_c2 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    cStack_c1 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    cStack_c0 = (char)extraout_XMM0_Qb_00;
    cStack_bf = (char)((ulong)extraout_XMM0_Qb_00 >> 8);
    cStack_be = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    cStack_bd = (char)((ulong)extraout_XMM0_Qb_00 >> 0x18);
    cStack_bc = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    cStack_bb = (char)((ulong)extraout_XMM0_Qb_00 >> 0x28);
    cStack_ba = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    cStack_b9 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x38);
    avg[1] = CONCAT17(cStack_c1 + (cVar9 - cStack_91),
                      CONCAT16(cStack_c2 + (cVar8 - cStack_92),
                               CONCAT15(cStack_c3 + (cVar7 - cStack_93),
                                        CONCAT14(cStack_c4 + (cVar6 - cStack_94),
                                                 CONCAT13(cStack_c5 + (cVar5 - cStack_95),
                                                          CONCAT12(cStack_c6 + (cVar4 - cStack_96),
                                                                   CONCAT11(cStack_c7 +
                                                                            (cVar3 - cStack_97),
                                                                            local_c8 +
                                                                            (cVar1 - local_98)))))))
                     );
    d[0] = CONCAT17(cStack_b9 + (cVar18 - cStack_89),
                    CONCAT16(cStack_ba + (cVar17 - cStack_8a),
                             CONCAT15(cStack_bb + (cVar16 - cStack_8b),
                                      CONCAT14(cStack_bc + (cVar15 - cStack_8c),
                                               CONCAT13(cStack_bd + (cVar14 - cStack_8d),
                                                        CONCAT12(cStack_be + (cVar13 - cStack_8e),
                                                                 CONCAT11(cStack_bf +
                                                                          (cVar12 - cStack_8f),
                                                                          cStack_c0 +
                                                                          (cVar10 - cStack_90)))))))
                   );
    alVar19[0] = (longlong)row;
    store4(prev_local,alVar19);
    rb = rb + 4;
    prev_local = prev_local + 4;
  }
  return;
}

Assistant:

void png_read_filter_row_avg4_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* The Avg filter predicts each pixel as the (truncated) average of a and b.
    * There's no pixel to the left of the first pixel.  Luckily, it's
    * predicted to be half of the pixel above it.  So again, this works
    * perfectly with our loop if we make sure a starts at zero.
    */
   size_t rb;
   const __m128i zero = _mm_setzero_si128();
   __m128i    b;
   __m128i a, d = zero;

   png_debug(1, "in png_read_filter_row_avg4_sse2");

   rb = row_info->rowbytes+4;
   while (rb > 4) {
      __m128i avg;
             b = load4(prev);
      a = d; d = load4(row );

      /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
      avg = _mm_avg_epu8(a,b);
      /* ...but we can fix it up by subtracting off 1 if it rounded up. */
      avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a,b),
                                            _mm_set1_epi8(1)));

      d = _mm_add_epi8(d, avg);
      store4(row, d);

      prev += 4;
      row  += 4;
      rb   -= 4;
   }
}